

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int GetDesiredMillisecondsPerFrame(void)

{
  int iVar1;
  SDL_DisplayMode mode;
  SDL_DisplayMode local_20;
  
  if ((int)VideoSurface12Location.flags < 0) {
    iVar1 = (*SDL20_GetWindowDisplayMode)(VideoWindow20,&local_20);
    if (iVar1 != 0 || local_20.refresh_rate == 0) {
      return 0xf;
    }
  }
  else {
    iVar1 = (*SDL20_GetCurrentDisplayMode)(VideoDisplayIndex,&local_20);
    if (local_20.refresh_rate == 0 || iVar1 != 0) {
      return 0xf;
    }
  }
  return (int)(1000 / (long)local_20.refresh_rate);
}

Assistant:

static int
GetDesiredMillisecondsPerFrame()
{
    SDL_DisplayMode mode;
    if (VideoSurface12->flags & SDL12_FULLSCREEN) {
       SDL_assert(VideoWindow20 != NULL);
       if (SDL20_GetWindowDisplayMode(VideoWindow20, &mode) == 0) {
           if (mode.refresh_rate) {
               return 1000 / mode.refresh_rate;
           }
       }
    } else if (SDL20_GetCurrentDisplayMode(VideoDisplayIndex, &mode) == 0) {
        /* If we're windowed, assume we're on the default screen. */
        if (mode.refresh_rate) {
            return 1000 / mode.refresh_rate;
        }
    }
    return 15;
}